

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

int class_metadata_attributes_impl_cb_iterate
              (set s,set_key key,set_value val,set_cb_iterate_args args)

{
  char *pcVar1;
  value *ppvVar2;
  value pvVar3;
  attribute_conflict in_RCX;
  value *v_array;
  class_metadata_iterator_args iterator;
  
  ppvVar2 = value_to_array((value)0x1271ff);
  pvVar3 = attribute_metadata(in_RCX);
  pcVar1 = in_RCX->name;
  in_RCX->name = pcVar1 + 1;
  ppvVar2[(long)pcVar1] = pvVar3;
  return 0;
}

Assistant:

int class_metadata_attributes_impl_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	class_metadata_iterator_args iterator = (class_metadata_iterator_args)args;
	value *v_array = value_to_array(iterator->v);

	(void)s;
	(void)key;

	v_array[iterator->count++] = attribute_metadata((attribute)val);

	return 0;
}